

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O2

DatabaseInterface * Fossilize::create_zip_archive_database(char *path,DatabaseMode mode)

{
  ZipDatabase *this;
  allocator local_41;
  string local_40;
  
  this = (ZipDatabase *)operator_new(0x2d8);
  std::__cxx11::string::string((string *)&local_40,path,&local_41);
  ZipDatabase::ZipDatabase(this,&local_40,mode);
  std::__cxx11::string::_M_dispose();
  return &this->super_DatabaseInterface;
}

Assistant:

DatabaseInterface *create_zip_archive_database(const char *path, DatabaseMode mode)
{
	auto *db = new ZipDatabase(path, mode);
	return db;
}